

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

bool __thiscall
QAbstractItemViewPrivate::openEditor
          (QAbstractItemViewPrivate *this,QModelIndex *index,QEvent *event)

{
  uint uVar1;
  QWidget *this_00;
  QWidget *pQVar2;
  QWidget *pQVar3;
  long in_FS_OFFSET;
  QModelIndex local_130;
  QModelIndex local_118;
  QStyleOptionViewItem local_100;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = *(QWidget **)
            &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
             field_0x8;
  local_118.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_118.r = -0x55555556;
  local_118.c = -0x55555556;
  local_118.i._0_4_ = 0xaaaaaaaa;
  local_118.i._4_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)this->model + 0x148))(&local_118,this->model,index);
  memset(&local_100,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&local_100);
  (**(code **)(*(long *)pQVar3 + 0x2f8))(pQVar3,&local_100);
  local_100.super_QStyleOption.rect =
       (QRect)(**(code **)(*(long *)pQVar3 + 0x1e0))(pQVar3,&local_118);
  QAbstractItemView::currentIndex(&local_130,(QAbstractItemView *)pQVar3);
  uVar1 = 0;
  if (((local_118.r == local_130.r) && (uVar1 = 0, local_118.c == local_130.c)) &&
     (CONCAT44(local_118.i._4_4_,(undefined4)local_118.i) == local_130.i)) {
    uVar1 = (uint)(local_118.m.ptr == local_130.m.ptr) << 8;
  }
  local_100.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)
       ((uint)local_100.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i | uVar1);
  this_00 = editor(this,&local_118,&local_100);
  if (this_00 != (QWidget *)0x0) {
    *(undefined4 *)(*(long *)&pQVar3->field_0x8 + 0x3a8) = 3;
    QWidget::show(this_00);
    if (this->waitForIMCommit == false) {
      QWidget::setFocus(this_00,OtherFocusReason);
    }
    else {
      QWidget::updateMicroFocus(pQVar3,ImQueryAll);
    }
    if (event != (QEvent *)0x0) {
      pQVar2 = QWidget::focusProxy(this_00);
      pQVar3 = this_00;
      if (pQVar2 != (QWidget *)0x0) {
        pQVar3 = QWidget::focusProxy(this_00);
      }
      QCoreApplication::sendEvent(&pQVar3->super_QObject,event);
    }
  }
  QBrush::~QBrush(&local_100.backgroundBrush);
  if (&(local_100.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_100.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_100.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_100.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_100.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&local_100.icon);
  QLocale::~QLocale(&local_100.locale);
  QFont::~QFont(&local_100.font);
  QStyleOption::~QStyleOption(&local_100.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this_00 != (QWidget *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractItemViewPrivate::openEditor(const QModelIndex &index, QEvent *event)
{
    Q_Q(QAbstractItemView);

    QModelIndex buddy = model->buddy(index);
    QStyleOptionViewItem options;
    q->initViewItemOption(&options);
    options.rect = q->visualRect(buddy);
    options.state |= (buddy == q->currentIndex() ? QStyle::State_HasFocus : QStyle::State_None);

    QWidget *w = editor(buddy, options);
    if (!w)
        return false;

    q->setState(QAbstractItemView::EditingState);
    w->show();
    if (!waitForIMCommit)
        w->setFocus();
    else
        q->updateMicroFocus();

    if (event)
        QCoreApplication::sendEvent(w->focusProxy() ? w->focusProxy() : w, event);

    return true;
}